

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O3

void __thiscall
swutil::SharedPtr<KeyFileReader<NWN::ResRef16>_>::SharedPtr
          (SharedPtr<KeyFileReader<NWN::ResRef16>_> *this,KeyFileReader<NWN::ResRef16> *Ptr)

{
  SharedState *pSVar1;
  undefined8 *puVar2;
  bad_alloc anon_var_0;
  
  this->m_SharedState = (SharedState *)0x0;
  this->m_Ptr = Ptr;
  if (Ptr != (KeyFileReader<NWN::ResRef16> *)0x0) {
    pSVar1 = (SharedState *)malloc(4);
    if (pSVar1 == (SharedState *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = strcpy;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *pSVar1 = 1;
    this->m_SharedState = pSVar1;
  }
  return;
}

Assistant:

SharedPtr(
			 T *Ptr
			)
			: m_Ptr( Ptr ),
			  m_SharedState( NULL )
		{
			if (m_Ptr)
			{
				try
				{
					m_SharedState = SharedPtrAllocSharedState( 1 );
				}
				catch (std::bad_alloc)
				{
					//
					// If we failed to allocate the shared state, delete the pointer
					// that had been transferred to us.  This is consistent with the
					// documentation for std::shared_ptr.  However, it might be
					// better to only allocate on first copy instead of right away,
					// which avoids the problem altogether.
					//

					SharedPtrDeleterDelete( Ptr );
					throw;
				}
			}
		}